

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxFunctionCall::Resolve(FxFunctionCall *this,FCompileContext *ctx)

{
  FArgumentList *args;
  FScriptPosition *sc;
  ENamedName EVar1;
  FxExpression **ppFVar2;
  FxExpression *pFVar3;
  PType *type;
  FRandom *expr;
  bool bVar4;
  int iVar5;
  PFunction *callee;
  FxFlopFunctionCall *this_00;
  undefined4 extraout_var;
  FxExpression *pFVar6;
  FxVMFunctionCall *this_01;
  PClass *pPVar7;
  FxConstant *pFVar8;
  FxMinMax *this_02;
  undefined8 *puVar9;
  PName **ppPVar10;
  FxConstant *this_03;
  undefined4 extraout_var_00;
  uint uVar12;
  FLOP *pFVar13;
  char *pcVar14;
  long lVar15;
  char *message;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  bool error;
  int max;
  int min;
  TArray<FxExpression_*,_FxExpression_*> pass;
  bool local_99;
  FRandom *local_98;
  int local_90;
  int local_8c;
  TArray<FxExpression_*,_FxExpression_*> local_88;
  FName local_6c;
  FName local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  _func_int **pp_Var11;
  
  if (ctx->Class == (PStruct *)0x0) {
LAB_005351f8:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    goto LAB_00535201;
  }
  local_99 = false;
  uVar18 = (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  if (uVar18 != 0) {
    lVar15 = 0;
    do {
      if (*(long *)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                   lVar15) == 0) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
        goto LAB_00534f5e;
      }
      lVar15 = lVar15 + 8;
    } while (uVar18 << 3 != lVar15);
  }
  args = &this->ArgList;
  local_34.Index = (this->MethodName).Index;
  sc = &(this->super_FxExpression).ScriptPosition;
  callee = FindClassMemberFunction(ctx->Class,ctx->Class,&local_34,sc,&local_99);
  if (callee != (PFunction *)0x0) {
    bVar4 = CheckFunctionCompatiblity(sc,ctx->Function,callee);
    if (!bVar4) goto LAB_005351f8;
    if ((((callee->Variants).Array)->Flags & 2) == 0) {
      pFVar6 = (FxExpression *)0x0;
    }
    else {
      pFVar6 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
      pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition(&pFVar6->ScriptPosition,sc);
      pFVar6->ValueType = (PType *)0x0;
      pFVar6->isresolved = false;
      pFVar6->NeedResult = true;
      pFVar6->ExprType = EFX_Self;
      pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00710728;
      *(undefined1 *)&pFVar6[1]._vptr_FxExpression = 0;
    }
    this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x68);
    FxVMFunctionCall::FxVMFunctionCall(this_01,pFVar6,callee,args,sc,false);
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pp_Var11 = (this_01->super_FxExpression)._vptr_FxExpression;
    goto LAB_00535b8a;
  }
  EVar1 = (this->MethodName).Index;
  local_98 = (FRandom *)args;
  if (EVar1 == FxFlops[0].Name) {
    bVar4 = false;
    uVar18 = 0;
  }
  else {
    pFVar13 = FxFlops;
    uVar18 = 0;
    do {
      uVar17 = uVar18;
      pFVar13 = pFVar13 + 1;
      bVar4 = 0xd < uVar17;
      if (uVar17 == 0xe) {
        pFVar6 = (FxExpression *)0x0;
        goto LAB_00535098;
      }
      uVar18 = uVar17 + 1;
    } while (EVar1 != pFVar13->Name);
    bVar4 = 0xd < uVar17;
  }
  this_00 = (FxFlopFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
  FxFlopFunctionCall::FxFlopFunctionCall(this_00,uVar18,(FArgumentList *)local_98,sc);
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  iVar5 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
  pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar5);
LAB_00535098:
  if (!bVar4) {
    return pFVar6;
  }
  iVar5 = (this->MethodName).Index;
  if (iVar5 - 0xfbU < 2) {
    local_8c = 1;
    local_90 = 5;
    iVar5 = -0x54;
  }
  else {
    iVar5 = P_FindLineSpecial(FName::NameData.NameArray[iVar5].Text,&local_8c,&local_90);
  }
  if (-1 < local_8c && iVar5 != 0) {
    uVar12 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if ((int)uVar12 < local_8c) {
      pcVar14 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      message = "Not enough parameters for \'%s\' (expected %d, got %d)";
LAB_005352b3:
      FScriptPosition::Message(sc,2,message,pcVar14);
LAB_00534f5e:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    if (local_90 < (int)uVar12) {
      pcVar14 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      message = "too many parameters for \'%s\' (expected %d, got %d)";
      goto LAB_005352b3;
    }
    if (((ctx->Function == (PFunction *)0x0) ||
        ((((ctx->Function->Variants).Array)->Flags & 2) == 0)) ||
       (bVar4 = DObject::IsKindOf((DObject *)ctx->Class,PClassActor::RegistrationInfo.MyClass),
       !bVar4)) {
      pFVar8 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
      FxConstant::FxConstant(pFVar8,sc);
    }
    else {
      pFVar8 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x30);
      (pFVar8->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition(&(pFVar8->super_FxExpression).ScriptPosition,sc);
      (pFVar8->super_FxExpression).ValueType = (PType *)0x0;
      (pFVar8->super_FxExpression).isresolved = false;
      (pFVar8->super_FxExpression).NeedResult = true;
      (pFVar8->super_FxExpression).ExprType = EFX_Self;
      (pFVar8->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00710728;
      *(undefined1 *)&(pFVar8->value).Type = 0;
    }
    this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
    FxActionSpecialCall::FxActionSpecialCall
              ((FxActionSpecialCall *)this_01,&pFVar8->super_FxExpression,iVar5,
               (FArgumentList *)local_98,sc);
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pp_Var11 = (this_01->super_FxExpression)._vptr_FxExpression;
    goto LAB_00535b8a;
  }
  local_38.Index = (this->MethodName).Index;
  pPVar7 = PClass::FindClass(&local_38);
  expr = local_98;
  if ((pPVar7 != (PClass *)0x0) && (pPVar7->bExported == true)) {
    local_3c.Index = (this->MethodName).Index;
    bVar4 = CheckArgSize(&local_3c,(FArgumentList *)local_98,1,1,sc);
    if (!bVar4) goto LAB_005351f8;
    this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar6 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              (&(this_01->super_FxExpression).ScriptPosition,&pFVar6->ScriptPosition);
    (this_01->super_FxExpression).ValueType = (PType *)0x0;
    (this_01->super_FxExpression).isresolved = false;
    (this_01->super_FxExpression).NeedResult = true;
    (this_01->super_FxExpression).ExprType = EFX_DynamicCast;
    (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxDynamicCast_007101e0;
    this_01->Self = pFVar6;
    *(PClass **)&this_01->EmitTail = pPVar7;
    *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression *)0x0;
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pp_Var11 = (this_01->super_FxExpression)._vptr_FxExpression;
    goto LAB_00535b8a;
  }
  iVar5 = (this->MethodName).Index;
  lVar15 = (long)iVar5;
  if (0x1e9 < lVar15) {
    uVar12 = iVar5 - 0x24e;
    if (uVar12 < 0x30) {
      if ((0xc00000030487U >> ((ulong)uVar12 & 0x3f) & 1) == 0) {
        if ((0xc00000UL >> ((ulong)uVar12 & 0x3f) & 1) != 0) {
          if ((int)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count < 2) {
            pcVar14 = FName::NameData.NameArray[lVar15].Text;
            uVar16 = 2;
            goto LAB_00535a32;
          }
          this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
          local_58.Index = (this->MethodName).Index;
          FxMinMax::FxMinMax((FxMinMax *)this_01,(TArray<FxExpression_*,_FxExpression_*> *)expr,
                             &local_58,sc);
          goto LAB_00535b6e;
        }
        goto LAB_00535633;
      }
    }
    else {
LAB_00535633:
      if (iVar5 != 0x1ea) {
        if (iVar5 != 0x204) goto switchD_0053523b_caseD_d8;
        if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count - 3 < 2) {
          this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
          FxColorLiteral::FxColorLiteral((FxColorLiteral *)this_01,(FArgumentList *)expr,sc);
          goto LAB_00535b6e;
        }
      }
    }
    local_40.Index = iVar5;
    bVar4 = CheckArgSize(&local_40,(FArgumentList *)local_98,1,1,sc);
    if (!bVar4) goto LAB_005359cc;
    iVar5 = (this->MethodName).Index;
    if (iVar5 < 0x25f) {
      switch(iVar5) {
      case 0x24e:
        ppPVar10 = (PName **)&TypeSInt32;
        break;
      case 0x24f:
        ppPVar10 = (PName **)&TypeUInt32;
        break;
      case 0x250:
        ppPVar10 = (PName **)&TypeBool;
        break;
      case 0x251:
      case 0x252:
      case 0x253:
      case 0x254:
      case 0x256:
      case 599:
switchD_0053533d_caseD_251:
        if (iVar5 == 0x204) {
          ppPVar10 = (PName **)&TypeColor;
        }
        else {
          ppPVar10 = (PName **)&TypeSound;
        }
        break;
      case 0x255:
      case 600:
        ppPVar10 = (PName **)&TypeFloat64;
        break;
      default:
        if (iVar5 != 0x1ea) goto switchD_0053533d_caseD_251;
        ppPVar10 = &TypeName;
      }
    }
    else if (iVar5 == 0x25f) {
      ppPVar10 = (PName **)&TypeState;
    }
    else if (iVar5 == 0x27c) {
      ppPVar10 = (PName **)&TypeSpriteID;
    }
    else {
      if (iVar5 != 0x27d) goto switchD_0053533d_caseD_251;
      ppPVar10 = (PName **)&TypeTextureID;
    }
    type = (PType *)*ppPVar10;
    this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
    FxTypeCast::FxTypeCast((FxTypeCast *)this_01,*(FxExpression **)expr->Name,type,true,true);
LAB_00535b63:
    *(FxExpression **)expr->Name = (FxExpression *)0x0;
    goto LAB_00535b6e;
  }
  switch(iVar5) {
  case 0xd1:
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
      local_98 = this->RNG;
      pFVar8 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
      FxConstant::FxConstant(pFVar8,0,sc);
      this_03 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
      FxConstant::FxConstant(this_03,0xff,sc);
      FxRandom::FxRandom((FxRandom *)this_01,local_98,(FxExpression *)pFVar8,(FxExpression *)this_03
                         ,sc,ctx->FromDecorate);
    }
    else {
      local_4c.Index = 0xd1;
      bVar4 = CheckArgSize(&local_4c,(FArgumentList *)local_98,2,2,sc);
      if (!bVar4) goto LAB_005359cc;
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
      ppFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      FxRandom::FxRandom((FxRandom *)this_01,this->RNG,*ppFVar2,ppFVar2[1],sc,ctx->FromDecorate);
LAB_00535930:
      (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[1] = (FxExpression *)0x0;
      *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression *)0x0;
    }
    break;
  case 0xd2:
    local_50.Index = 0xd2;
    bVar4 = CheckArgSize(&local_50,(FArgumentList *)local_98,2,2,sc);
    if (bVar4) {
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x48);
      ppFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      FxFRandom::FxFRandom((FxFRandom *)this_01,this->RNG,*ppFVar2,ppFVar2[1],sc);
      goto LAB_00535930;
    }
    goto LAB_005359cc;
  case 0xd3:
    local_54.Index = 0xd3;
    this_01 = (FxVMFunctionCall *)0x0;
    bVar4 = CheckArgSize(&local_54,(FArgumentList *)local_98,0,1,sc);
    if (bVar4) {
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
        pFVar6 = (FxExpression *)0x0;
      }
      else {
        pFVar6 = *(FxExpression **)expr->Name;
      }
      FxRandom2::FxRandom2((FxRandom2 *)this_01,this->RNG,pFVar6,sc,ctx->FromDecorate);
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) break;
      goto LAB_00535b63;
    }
    break;
  case 0xd4:
  case 0xd5:
    if ((int)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count < 1) {
      pcVar14 = FName::NameData.NameArray[lVar15].Text;
      uVar16 = 1;
LAB_00535a32:
      this_01 = (FxVMFunctionCall *)0x0;
      FScriptPosition::Message
                (sc,2,"Insufficient arguments in call to %s, expected %d, got %d",pcVar14,uVar16);
    }
    else {
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
      FxRandomPick::FxRandomPick
                ((FxRandomPick *)this_01,this->RNG,(TArray<FxExpression_*,_FxExpression_*> *)expr,
                 (this->MethodName).Index == 0xd5,sc,ctx->FromDecorate);
    }
    break;
  case 0xd6:
    local_44.Index = 0xd6;
    this_01 = (FxVMFunctionCall *)0x0;
    bVar4 = CheckArgSize(&local_44,(FArgumentList *)local_98,0,0,sc);
    if (bVar4) {
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x30);
      puVar9 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x30);
      *puVar9 = &PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition((FScriptPosition *)(puVar9 + 1),sc);
      puVar9[3] = 0;
      *(undefined2 *)(puVar9 + 4) = 0x100;
      *(undefined4 *)((long)puVar9 + 0x24) = 0x24;
      *puVar9 = &PTR__FxExpression_00710728;
      *(undefined1 *)(puVar9 + 5) = 0;
      (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_01->super_FxExpression).ScriptPosition,(FScriptPosition *)(puVar9 + 1));
      (this_01->super_FxExpression).ValueType = (PType *)0x0;
      (this_01->super_FxExpression).isresolved = false;
      (this_01->super_FxExpression).NeedResult = true;
      (this_01->super_FxExpression).ExprType = EFX_GetClass;
      (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_00710c70;
      *(undefined8 **)&this_01->EmitTail = puVar9;
    }
    break;
  case 0xd7:
    local_48.Index = 0xd7;
    bVar4 = CheckArgSize(&local_48,(FArgumentList *)local_98,1,1,sc);
    if (!bVar4) goto LAB_005359cc;
    this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x30);
    pFVar6 = *(FxExpression **)expr->Name;
    (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              (&(this_01->super_FxExpression).ScriptPosition,&pFVar6->ScriptPosition);
    (this_01->super_FxExpression).ValueType = (PType *)0x0;
    (this_01->super_FxExpression).isresolved = false;
    (this_01->super_FxExpression).NeedResult = true;
    (this_01->super_FxExpression).ExprType = EFX_GetDefaultByType;
    (this_01->super_FxExpression)._vptr_FxExpression =
         (_func_int **)&PTR__FxGetDefaultByType_00710cd8;
    *(FxExpression **)&this_01->EmitTail = pFVar6;
    *(FxExpression **)expr->Name = (FxExpression *)0x0;
    break;
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
switchD_0053523b_caseD_d8:
    this_01 = (FxVMFunctionCall *)0x0;
    FScriptPosition::Message
              (sc,2,"Call to unknown function \'%s\'",FName::NameData.NameArray[lVar15].Text);
    break;
  case 0xe4:
  case 0xe5:
    local_6c.Index = iVar5;
    bVar4 = CheckArgSize(&local_6c,(FArgumentList *)local_98,2,2,sc);
    if (bVar4) {
      bVar4 = (this->MethodName).Index == 0xe4;
      this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x38);
      ppFVar2 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      pFVar6 = ppFVar2[!bVar4];
      pFVar3 = ppFVar2[bVar4];
      (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition(&(this_01->super_FxExpression).ScriptPosition,sc);
      (this_01->super_FxExpression).ValueType = (PType *)0x0;
      (this_01->super_FxExpression).isresolved = false;
      (this_01->super_FxExpression).NeedResult = true;
      (this_01->super_FxExpression).ExprType = EFX_ATan2;
      (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxATan2_00710318;
      *(FxExpression **)&this_01->EmitTail = pFVar6;
      this_01->Self = pFVar3;
      (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array[1] = (FxExpression *)0x0;
      *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression *)0x0;
    }
    else {
      this_01 = (FxVMFunctionCall *)0x0;
    }
    break;
  default:
    if (iVar5 == 0xfa) {
      local_68.Index = iVar5;
      bVar4 = CheckArgSize(&local_68,(FArgumentList *)local_98,1,1,sc);
      if (bVar4) {
        this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x30);
        FxAbs::FxAbs((FxAbs *)this_01,*(FxExpression **)expr->Name);
        goto LAB_00535b63;
      }
    }
    else {
      if (iVar5 != 0x10b) goto switchD_0053523b_caseD_d8;
      local_5c.Index = iVar5;
      bVar4 = CheckArgSize(&local_5c,(FArgumentList *)local_98,3,3,sc);
      if (bVar4) {
        local_88.Array = (FxExpression **)0x0;
        local_88.Most = 0;
        local_88.Count = 0;
        TArray<FxExpression_*,_FxExpression_*>::Resize(&local_88,2);
        *local_88.Array = *(FxExpression **)expr->Name;
        local_88.Array[1] = *(FxExpression **)((long)expr->Name + 8);
        this_02 = (FxMinMax *)FMemArena::Alloc(&FxAlloc,0x40);
        local_60.Index = 0x265;
        FxMinMax::FxMinMax(this_02,&local_88,&local_60,sc);
        *local_88.Array = (FxExpression *)this_02;
        local_88.Array[1] = *(FxExpression **)((long)expr->Name + 0x10);
        this_01 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x40);
        local_64.Index = 0x264;
        FxMinMax::FxMinMax((FxMinMax *)this_01,&local_88,&local_64,sc);
        *(FxExpression **)((long)expr->Name + 0x10) = (FxExpression *)0x0;
        *(FxExpression **)((long)expr->Name + 8) = (FxExpression *)0x0;
        *(FxExpression **)expr->Name = (FxExpression *)0x0;
        TArray<FxExpression_*,_FxExpression_*>::~TArray(&local_88);
        break;
      }
    }
LAB_005359cc:
    this_01 = (FxVMFunctionCall *)0x0;
  }
LAB_00535b6e:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  if (this_01 == (FxVMFunctionCall *)0x0) {
LAB_00535201:
    pFVar6 = (FxExpression *)0x0;
  }
  else {
    pp_Var11 = (this_01->super_FxExpression)._vptr_FxExpression;
LAB_00535b8a:
    iVar5 = (*pp_Var11[2])(this_01,ctx);
    pFVar6 = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  }
  return pFVar6;
}

Assistant:

FxExpression *FxFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	bool error = false;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	PFunction *afd = FindClassMemberFunction(ctx.Class, ctx.Class, MethodName, ScriptPosition, &error);

	if (afd != nullptr)
	{
		if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
		{
			delete this;
			return nullptr;
		}

		auto self = (afd->Variants[0].Flags & VARF_Method)? new FxSelf(ScriptPosition) : nullptr;
		auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, false);
		delete this;
		return x->Resolve(ctx);
	}

	for (size_t i = 0; i < countof(FxFlops); ++i)
	{
		if (MethodName == FxFlops[i].Name)
		{
			FxExpression *x = new FxFlopFunctionCall(i, ArgList, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	int min, max, special;
	if (MethodName == NAME_ACS_NamedExecuteWithResult || MethodName == NAME_CallACS)
	{
		special = -ACS_ExecuteWithResult;
		min = 1;
		max = 5;
	}
	else
	{
		special = P_FindLineSpecial(MethodName.GetChars(), &min, &max);
	}
	if (special != 0 && min >= 0)
	{
		int paramcount = ArgList.Size();
		if (paramcount < min)
		{
			ScriptPosition.Message(MSG_ERROR, "Not enough parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), min, paramcount);
			delete this;
			return nullptr;
		}
		else if (paramcount > max)
		{
			ScriptPosition.Message(MSG_ERROR, "too many parameters for '%s' (expected %d, got %d)", 
				MethodName.GetChars(), max, paramcount);
			delete this;
			return nullptr;
		}
		FxExpression *self = (ctx.Function && (ctx.Function->Variants[0].Flags & VARF_Method) && ctx.Class->IsKindOf(RUNTIME_CLASS(PClassActor))) ? new FxSelf(ScriptPosition) : (FxExpression*)new FxConstant(ScriptPosition);
		FxExpression *x = new FxActionSpecialCall(self, special, ArgList, ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	PClass *cls = PClass::FindClass(MethodName);
	if (cls != nullptr && cls->bExported)
	{
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			FxExpression *x = new FxDynamicCast(cls, ArgList[0]);
			ArgList[0] = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			delete this;
			return nullptr;
		}
	}


	// Last but not least: Check builtins and type casts. The random functions can take a named RNG if specified.
	// Note that for all builtins the used arguments have to be nulled in the ArgList so that they won't get deleted before they get used.
	FxExpression *func = nullptr;

	switch (MethodName)
	{
	case NAME_Color:
		if (ArgList.Size() == 3 || ArgList.Size() == 4)
		{
			func = new FxColorLiteral(ArgList, ScriptPosition);
			break;
		}
		// fall through
	case NAME_Bool:
	case NAME_Int:
	case NAME_uInt:
	case NAME_Float:
	case NAME_Double:
	case NAME_Name:
	case NAME_Sound:
	case NAME_State:
	case NAME_SpriteID:
	case NAME_TextureID:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			PType *type = 
				MethodName == NAME_Bool ? TypeBool :
				MethodName == NAME_Int ? TypeSInt32 :
				MethodName == NAME_uInt ? TypeUInt32 :
				MethodName == NAME_Float ? TypeFloat64 :
				MethodName == NAME_Double ? TypeFloat64 :
				MethodName == NAME_Name ? TypeName :
				MethodName == NAME_SpriteID ? TypeSpriteID :
				MethodName == NAME_TextureID ? TypeTextureID :
				MethodName == NAME_State ? TypeState :
				MethodName == NAME_Color ? TypeColor : (PType*)TypeSound;

			func = new FxTypeCast(ArgList[0], type, true, true);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_GetClass:
		if (CheckArgSize(NAME_GetClass, ArgList, 0, 0, ScriptPosition))
		{
			func = new FxGetClass(new FxSelf(ScriptPosition));
		}
		break;

	case NAME_GetDefaultByType:
		if (CheckArgSize(NAME_GetDefaultByType, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxGetDefaultByType(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_Random:
		// allow calling Random without arguments to default to (0, 255)
		if (ArgList.Size() == 0)
		{
			func = new FxRandom(RNG, new FxConstant(0, ScriptPosition), new FxConstant(255, ScriptPosition), ScriptPosition, ctx.FromDecorate);
		}
		else if (CheckArgSize(NAME_Random, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxRandom(RNG, ArgList[0], ArgList[1], ScriptPosition, ctx.FromDecorate);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_FRandom:
		if (CheckArgSize(NAME_FRandom, ArgList, 2, 2, ScriptPosition))
		{
			func = new FxFRandom(RNG, ArgList[0], ArgList[1], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	case NAME_RandomPick:
	case NAME_FRandomPick:
		if (CheckArgSize(MethodName, ArgList, 1, -1, ScriptPosition))
		{
			func = new FxRandomPick(RNG, ArgList, MethodName == NAME_FRandomPick, ScriptPosition, ctx.FromDecorate);
		}
		break;

	case NAME_Random2:
		if (CheckArgSize(NAME_Random2, ArgList, 0, 1, ScriptPosition))
		{
			func = new FxRandom2(RNG, ArgList.Size() == 0? nullptr : ArgList[0], ScriptPosition, ctx.FromDecorate);
			if (ArgList.Size() > 0) ArgList[0] = nullptr;
		}
		break;

	case NAME_Min:
	case NAME_Max:
		if (CheckArgSize(MethodName, ArgList, 2, -1, ScriptPosition))
		{
			func = new FxMinMax(ArgList, MethodName, ScriptPosition);
		}
		break;

	case NAME_Clamp:
		if (CheckArgSize(MethodName, ArgList, 3, 3, ScriptPosition))
		{
			TArray<FxExpression *> pass;
			pass.Resize(2);
			pass[0] = ArgList[0];
			pass[1] = ArgList[1];
			pass[0] = new FxMinMax(pass, NAME_Max, ScriptPosition);
			pass[1] = ArgList[2];
			func = new FxMinMax(pass, NAME_Min, ScriptPosition);
			ArgList[0] = ArgList[1] = ArgList[2] = nullptr;
		}
		break;

	case NAME_Abs:
		if (CheckArgSize(MethodName, ArgList, 1, 1, ScriptPosition))
		{
			func = new FxAbs(ArgList[0]);
			ArgList[0] = nullptr;
		}
		break;

	case NAME_ATan2:
	case NAME_VectorAngle:
		if (CheckArgSize(MethodName, ArgList, 2, 2, ScriptPosition))
		{
			func = MethodName == NAME_ATan2 ? new FxATan2(ArgList[0], ArgList[1], ScriptPosition) : new FxATan2(ArgList[1], ArgList[0], ScriptPosition);
			ArgList[0] = ArgList[1] = nullptr;
		}
		break;

	default:
		ScriptPosition.Message(MSG_ERROR, "Call to unknown function '%s'", MethodName.GetChars());
		break;
	}
	if (func != nullptr)
	{
		delete this;
		return func->Resolve(ctx);
	}
	delete this;
	return nullptr;
}